

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  size_t k;
  ulong uVar14;
  vbool<8>_conflict valid0;
  byte bVar15;
  bool bVar16;
  long lVar17;
  ulong uVar18;
  byte bVar19;
  long lVar20;
  byte bVar21;
  NodeRef root;
  long lVar22;
  undefined1 (*pauVar23) [32];
  ulong *puVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar27 [16];
  undefined1 auVar40 [32];
  undefined1 auVar28 [16];
  undefined1 auVar41 [32];
  undefined1 auVar29 [16];
  undefined1 auVar42 [32];
  undefined1 auVar30 [16];
  undefined1 auVar43 [32];
  undefined1 auVar31 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  undefined1 in_ZMM2 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  Precalculations pre;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5adc;
  Precalculations local_5acd;
  undefined4 local_5acc;
  ulong local_5ac8;
  RayQueryContext *local_5ac0;
  BVH *local_5ab8;
  Intersectors *local_5ab0;
  RayK<8> *local_5aa8;
  undefined1 local_5aa0 [32];
  ulong local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined1 local_5a60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  undefined1 local_58e0 [32];
  int local_58c0;
  int iStack_58bc;
  int iStack_58b8;
  int iStack_58b4;
  int iStack_58b0;
  int iStack_58ac;
  int iStack_58a8;
  int iStack_58a4;
  uint local_58a0;
  uint uStack_589c;
  uint uStack_5898;
  uint uStack_5894;
  uint uStack_5890;
  uint uStack_588c;
  uint uStack_5888;
  uint uStack_5884;
  uint local_5880;
  uint uStack_587c;
  uint uStack_5878;
  uint uStack_5874;
  uint uStack_5870;
  uint uStack_586c;
  uint uStack_5868;
  uint uStack_5864;
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  
  local_5ab8 = (BVH *)This->ptr;
  local_5808 = (local_5ab8->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar35 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar26 = ZEXT816(0) << 0x40;
      uVar25 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar26),5);
      uVar18 = vpcmpeqd_avx512vl(auVar35,(undefined1  [32])valid_i->field_0);
      uVar25 = uVar25 & uVar18;
      bVar15 = (byte)uVar25;
      if (bVar15 != 0) {
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar37._8_4_ = 0x7fffffff;
        auVar37._0_8_ = 0x7fffffff7fffffff;
        auVar37._12_4_ = 0x7fffffff;
        auVar37._16_4_ = 0x7fffffff;
        auVar37._20_4_ = 0x7fffffff;
        auVar37._24_4_ = 0x7fffffff;
        auVar37._28_4_ = 0x7fffffff;
        auVar35 = vandps_avx(auVar37,local_59e0);
        auVar33._8_4_ = 0x219392ef;
        auVar33._0_8_ = 0x219392ef219392ef;
        auVar33._12_4_ = 0x219392ef;
        auVar33._16_4_ = 0x219392ef;
        auVar33._20_4_ = 0x219392ef;
        auVar33._24_4_ = 0x219392ef;
        auVar33._28_4_ = 0x219392ef;
        uVar18 = vcmpps_avx512vl(auVar35,auVar33,1);
        bVar16 = (bool)((byte)uVar18 & 1);
        auVar34._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59e0._0_4_;
        bVar16 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar34._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59e0._4_4_;
        bVar16 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar34._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59e0._8_4_;
        bVar16 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar34._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59e0._12_4_;
        bVar16 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar34._16_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59e0._16_4_;
        bVar16 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar34._20_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59e0._20_4_;
        bVar16 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar34._24_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59e0._24_4_;
        bVar16 = SUB81(uVar18 >> 7,0);
        auVar34._28_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59e0._28_4_;
        auVar35 = vandps_avx(auVar37,local_59c0);
        uVar18 = vcmpps_avx512vl(auVar35,auVar33,1);
        bVar16 = (bool)((byte)uVar18 & 1);
        auVar32._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59c0._0_4_;
        bVar16 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar32._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59c0._4_4_;
        bVar16 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar32._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59c0._8_4_;
        bVar16 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar32._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59c0._12_4_;
        bVar16 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar32._16_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59c0._16_4_;
        bVar16 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar32._20_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59c0._20_4_;
        bVar16 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar32._24_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59c0._24_4_;
        bVar16 = SUB81(uVar18 >> 7,0);
        auVar32._28_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59c0._28_4_;
        auVar35 = vandps_avx(auVar37,local_59a0);
        uVar18 = vcmpps_avx512vl(auVar35,auVar33,1);
        bVar16 = (bool)((byte)uVar18 & 1);
        auVar35._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59a0._0_4_;
        bVar16 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59a0._4_4_;
        bVar16 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59a0._8_4_;
        bVar16 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59a0._12_4_;
        bVar16 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59a0._16_4_;
        bVar16 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59a0._20_4_;
        bVar16 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59a0._24_4_;
        bVar16 = SUB81(uVar18 >> 7,0);
        auVar35._28_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * local_59a0._28_4_;
        auVar36._8_4_ = 0x3f800000;
        auVar36._0_8_ = 0x3f8000003f800000;
        auVar36._12_4_ = 0x3f800000;
        auVar36._16_4_ = 0x3f800000;
        auVar36._20_4_ = 0x3f800000;
        auVar36._24_4_ = 0x3f800000;
        auVar36._28_4_ = 0x3f800000;
        auVar33 = vrcp14ps_avx512vl(auVar34);
        auVar27 = vfnmadd213ps_fma(auVar34,auVar33,auVar36);
        auVar27 = vfmadd132ps_fma(ZEXT1632(auVar27),auVar33,auVar33);
        auVar34 = vrcp14ps_avx512vl(auVar32);
        auVar28 = vfnmadd213ps_fma(auVar32,auVar34,auVar36);
        auVar28 = vfmadd132ps_fma(ZEXT1632(auVar28),auVar34,auVar34);
        auVar34 = vrcp14ps_avx512vl(auVar35);
        auVar29 = vfnmadd213ps_fma(auVar35,auVar34,auVar36);
        local_5980 = ZEXT1632(auVar27);
        local_5960 = ZEXT1632(auVar28);
        auVar29 = vfmadd132ps_fma(ZEXT1632(auVar29),auVar34,auVar34);
        local_5940 = ZEXT1632(auVar29);
        local_5920 = (float)local_5a40._0_4_ * auVar27._0_4_;
        fStack_591c = (float)local_5a40._4_4_ * auVar27._4_4_;
        fStack_5918 = (float)local_5a40._8_4_ * auVar27._8_4_;
        fStack_5914 = (float)local_5a40._12_4_ * auVar27._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar28._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar28._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar28._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar28._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0._4_4_ = (float)local_5a40._68_4_ * auVar29._4_4_;
        local_58e0._0_4_ = (float)local_5a40._64_4_ * auVar29._0_4_;
        local_58e0._8_4_ = (float)local_5a40._72_4_ * auVar29._8_4_;
        local_58e0._12_4_ = (float)local_5a40._76_4_ * auVar29._12_4_;
        local_58e0._16_4_ = (float)local_5a40._80_4_ * 0.0;
        local_58e0._20_4_ = (float)local_5a40._84_4_ * 0.0;
        local_58e0._24_4_ = (float)local_5a40._88_4_ * 0.0;
        local_58e0._28_4_ = local_5a40._92_4_;
        uVar18 = vcmpps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar26),1);
        auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_58c0 = (uint)((byte)uVar18 & 1) * auVar35._0_4_;
        iStack_58bc = (uint)((byte)(uVar18 >> 1) & 1) * auVar35._4_4_;
        iStack_58b8 = (uint)((byte)(uVar18 >> 2) & 1) * auVar35._8_4_;
        iStack_58b4 = (uint)((byte)(uVar18 >> 3) & 1) * auVar35._12_4_;
        iStack_58b0 = (uint)((byte)(uVar18 >> 4) & 1) * auVar35._16_4_;
        iStack_58ac = (uint)((byte)(uVar18 >> 5) & 1) * auVar35._20_4_;
        iStack_58a8 = (uint)((byte)(uVar18 >> 6) & 1) * auVar35._24_4_;
        iStack_58a4 = (uint)(byte)(uVar18 >> 7) * auVar35._28_4_;
        auVar34 = ZEXT1632(auVar26);
        uVar18 = vcmpps_avx512vl(ZEXT1632(auVar28),auVar34,5);
        auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar16 = (bool)((byte)uVar18 & 1);
        local_58a0 = (uint)bVar16 * auVar35._0_4_ | (uint)!bVar16 * 0x60;
        bVar16 = (bool)((byte)(uVar18 >> 1) & 1);
        uStack_589c = (uint)bVar16 * auVar35._4_4_ | (uint)!bVar16 * 0x60;
        bVar16 = (bool)((byte)(uVar18 >> 2) & 1);
        uStack_5898 = (uint)bVar16 * auVar35._8_4_ | (uint)!bVar16 * 0x60;
        bVar16 = (bool)((byte)(uVar18 >> 3) & 1);
        uStack_5894 = (uint)bVar16 * auVar35._12_4_ | (uint)!bVar16 * 0x60;
        bVar16 = (bool)((byte)(uVar18 >> 4) & 1);
        uStack_5890 = (uint)bVar16 * auVar35._16_4_ | (uint)!bVar16 * 0x60;
        bVar16 = (bool)((byte)(uVar18 >> 5) & 1);
        uStack_588c = (uint)bVar16 * auVar35._20_4_ | (uint)!bVar16 * 0x60;
        bVar16 = (bool)((byte)(uVar18 >> 6) & 1);
        uStack_5888 = (uint)bVar16 * auVar35._24_4_ | (uint)!bVar16 * 0x60;
        bVar16 = SUB81(uVar18 >> 7,0);
        uStack_5884 = (uint)bVar16 * auVar35._28_4_ | (uint)!bVar16 * 0x60;
        uVar18 = vcmpps_avx512vl(ZEXT1632(auVar29),auVar34,5);
        auVar35 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar16 = (bool)((byte)uVar18 & 1);
        local_5880 = (uint)bVar16 * auVar35._0_4_ | (uint)!bVar16 * 0xa0;
        bVar16 = (bool)((byte)(uVar18 >> 1) & 1);
        uStack_587c = (uint)bVar16 * auVar35._4_4_ | (uint)!bVar16 * 0xa0;
        bVar16 = (bool)((byte)(uVar18 >> 2) & 1);
        uStack_5878 = (uint)bVar16 * auVar35._8_4_ | (uint)!bVar16 * 0xa0;
        bVar16 = (bool)((byte)(uVar18 >> 3) & 1);
        uStack_5874 = (uint)bVar16 * auVar35._12_4_ | (uint)!bVar16 * 0xa0;
        bVar16 = (bool)((byte)(uVar18 >> 4) & 1);
        uStack_5870 = (uint)bVar16 * auVar35._16_4_ | (uint)!bVar16 * 0xa0;
        bVar16 = (bool)((byte)(uVar18 >> 5) & 1);
        uStack_586c = (uint)bVar16 * auVar35._20_4_ | (uint)!bVar16 * 0xa0;
        bVar16 = (bool)((byte)(uVar18 >> 6) & 1);
        uStack_5868 = (uint)bVar16 * auVar35._24_4_ | (uint)!bVar16 * 0xa0;
        bVar16 = SUB81(uVar18 >> 7,0);
        uStack_5864 = (uint)bVar16 * auVar35._28_4_ | (uint)!bVar16 * 0xa0;
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar63 = ZEXT3264(local_4680);
        auVar35 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar34);
        local_5860 = (uint)(bVar15 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar15 & 1) * 0x7f800000;
        bVar16 = (bool)((byte)(uVar25 >> 1) & 1);
        uStack_585c = (uint)bVar16 * auVar35._4_4_ | (uint)!bVar16 * 0x7f800000;
        bVar16 = (bool)((byte)(uVar25 >> 2) & 1);
        uStack_5858 = (uint)bVar16 * auVar35._8_4_ | (uint)!bVar16 * 0x7f800000;
        bVar16 = (bool)((byte)(uVar25 >> 3) & 1);
        uStack_5854 = (uint)bVar16 * auVar35._12_4_ | (uint)!bVar16 * 0x7f800000;
        bVar16 = (bool)((byte)(uVar25 >> 4) & 1);
        uStack_5850 = (uint)bVar16 * auVar35._16_4_ | (uint)!bVar16 * 0x7f800000;
        bVar16 = (bool)((byte)(uVar25 >> 5) & 1);
        uStack_584c = (uint)bVar16 * auVar35._20_4_ | (uint)!bVar16 * 0x7f800000;
        bVar16 = (bool)((byte)(uVar25 >> 6) & 1);
        uStack_5848 = (uint)bVar16 * auVar35._24_4_ | (uint)!bVar16 * 0x7f800000;
        bVar16 = SUB81(uVar25 >> 7,0);
        uStack_5844 = (uint)bVar16 * auVar35._28_4_ | (uint)!bVar16 * 0x7f800000;
        local_5acc = (undefined4)uVar25;
        auVar35 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar34);
        bVar16 = (bool)((byte)(uVar25 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar25 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar25 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar25 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar25 >> 6) & 1);
        bVar10 = SUB81(uVar25 >> 7,0);
        local_5840._4_4_ = (uint)bVar16 * auVar35._4_4_ | (uint)!bVar16 * -0x800000;
        local_5840._0_4_ =
             (uint)(bVar15 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar15 & 1) * -0x800000;
        local_5840._8_4_ = (uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * -0x800000;
        local_5840._12_4_ = (uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * -0x800000;
        local_5840._16_4_ = (uint)bVar7 * auVar35._16_4_ | (uint)!bVar7 * -0x800000;
        local_5840._20_4_ = (uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * -0x800000;
        local_5840._24_4_ = (uint)bVar9 * auVar35._24_4_ | (uint)!bVar9 * -0x800000;
        local_5840._28_4_ = (uint)bVar10 * auVar35._28_4_ | (uint)!bVar10 * -0x800000;
        local_5adc = (uint)(byte)~bVar15;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar25 = 7;
        }
        else {
          uVar25 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5aa8 = ray + 0x100;
        puVar24 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar23 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5860;
        uStack_465c = uStack_585c;
        uStack_4658 = uStack_5858;
        uStack_4654 = uStack_5854;
        uStack_4650 = uStack_5850;
        uStack_464c = uStack_584c;
        uStack_4648 = uStack_5848;
        uStack_4644 = uStack_5844;
        local_5ac0 = context;
        local_5ab0 = This;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
LAB_01ddc160:
        do {
          do {
            root.ptr = puVar24[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01ddc8fc;
            puVar24 = puVar24 + -1;
            local_5a60 = pauVar23[-1];
            auVar65 = ZEXT3264(local_5a60);
            pauVar23 = pauVar23 + -1;
            local_5a80 = vcmpps_avx512vl(local_5a60,local_5840,1);
          } while ((char)local_5a80 == '\0');
          local_5ac8 = (ulong)(uint)POPCOUNT((int)local_5a80);
          if (uVar25 < local_5ac8) {
LAB_01ddc1a6:
            do {
              auVar35 = auVar63._0_32_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01ddc8fc;
                uVar11 = vcmpps_avx512vl(local_5840,auVar65._0_32_,6);
                if ((char)uVar11 == '\0') goto LAB_01ddc160;
                bVar15 = ~(byte)local_5adc;
                uStack_5a78 = *(undefined8 *)(ray + 0x68);
                uStack_5a70 = *(undefined8 *)(ray + 0x70);
                uStack_5a68 = *(undefined8 *)(ray + 0x78);
                auVar34 = *(undefined1 (*) [32])(ray + 0xa0);
                auVar32 = *(undefined1 (*) [32])(ray + 0xc0);
                auVar33 = *(undefined1 (*) [32])(ray + 0x80);
                local_5aa0 = *(undefined1 (*) [32])(ray + 0x100);
                lVar22 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                lVar17 = 0;
                goto LAB_01ddc3b1;
              }
              uVar18 = 8;
              auVar34 = auVar35;
              for (lVar17 = 0;
                  (auVar65 = ZEXT3264(auVar34), lVar17 != 8 &&
                  (uVar4 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar17 * 8), uVar4 != 8));
                  lVar17 = lVar17 + 1) {
                auVar48._4_4_ = fStack_591c;
                auVar48._0_4_ = local_5920;
                auVar48._8_4_ = fStack_5918;
                auVar48._12_4_ = fStack_5914;
                auVar48._16_4_ = fStack_5910;
                auVar48._20_4_ = fStack_590c;
                auVar48._24_4_ = fStack_5908;
                auVar48._28_4_ = uStack_5904;
                uVar1 = *(undefined4 *)(root.ptr + 0x40 + lVar17 * 4);
                auVar60._4_4_ = uVar1;
                auVar60._0_4_ = uVar1;
                auVar60._8_4_ = uVar1;
                auVar60._12_4_ = uVar1;
                auVar60._16_4_ = uVar1;
                auVar60._20_4_ = uVar1;
                auVar60._24_4_ = uVar1;
                auVar60._28_4_ = uVar1;
                auVar26 = vfmsub132ps_fma(auVar60,auVar48,local_5980);
                auVar49._4_4_ = fStack_58fc;
                auVar49._0_4_ = local_5900;
                auVar49._8_4_ = fStack_58f8;
                auVar49._12_4_ = fStack_58f4;
                auVar49._16_4_ = fStack_58f0;
                auVar49._20_4_ = fStack_58ec;
                auVar49._24_4_ = fStack_58e8;
                auVar49._28_4_ = uStack_58e4;
                uVar1 = *(undefined4 *)(root.ptr + 0x80 + lVar17 * 4);
                auVar61._4_4_ = uVar1;
                auVar61._0_4_ = uVar1;
                auVar61._8_4_ = uVar1;
                auVar61._12_4_ = uVar1;
                auVar61._16_4_ = uVar1;
                auVar61._20_4_ = uVar1;
                auVar61._24_4_ = uVar1;
                auVar61._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(root.ptr + 0xc0 + lVar17 * 4);
                auVar62._4_4_ = uVar1;
                auVar62._0_4_ = uVar1;
                auVar62._8_4_ = uVar1;
                auVar62._12_4_ = uVar1;
                auVar62._16_4_ = uVar1;
                auVar62._20_4_ = uVar1;
                auVar62._24_4_ = uVar1;
                auVar62._28_4_ = uVar1;
                auVar27 = vfmsub132ps_fma(auVar61,auVar49,local_5960);
                auVar28 = vfmsub132ps_fma(auVar62,local_58e0,local_5940);
                uVar1 = *(undefined4 *)(root.ptr + 0x60 + lVar17 * 4);
                auVar45._4_4_ = uVar1;
                auVar45._0_4_ = uVar1;
                auVar45._8_4_ = uVar1;
                auVar45._12_4_ = uVar1;
                auVar45._16_4_ = uVar1;
                auVar45._20_4_ = uVar1;
                auVar45._24_4_ = uVar1;
                auVar45._28_4_ = uVar1;
                auVar36 = vfmsub132ps_avx512vl(local_5980,auVar48,auVar45);
                uVar1 = *(undefined4 *)(root.ptr + 0xa0 + lVar17 * 4);
                auVar46._4_4_ = uVar1;
                auVar46._0_4_ = uVar1;
                auVar46._8_4_ = uVar1;
                auVar46._12_4_ = uVar1;
                auVar46._16_4_ = uVar1;
                auVar46._20_4_ = uVar1;
                auVar46._24_4_ = uVar1;
                auVar46._28_4_ = uVar1;
                auVar37 = vfmsub132ps_avx512vl(local_5960,auVar49,auVar46);
                uVar1 = *(undefined4 *)(root.ptr + 0xe0 + lVar17 * 4);
                auVar47._4_4_ = uVar1;
                auVar47._0_4_ = uVar1;
                auVar47._8_4_ = uVar1;
                auVar47._12_4_ = uVar1;
                auVar47._16_4_ = uVar1;
                auVar47._20_4_ = uVar1;
                auVar47._24_4_ = uVar1;
                auVar47._28_4_ = uVar1;
                auVar38 = vfmsub132ps_avx512vl(local_5940,local_58e0,auVar47);
                auVar32 = vpminsd_avx2(ZEXT1632(auVar26),auVar36);
                auVar33 = vpminsd_avx2(ZEXT1632(auVar27),auVar37);
                auVar32 = vpmaxsd_avx2(auVar32,auVar33);
                auVar33 = vpminsd_avx2(ZEXT1632(auVar28),auVar38);
                auVar32 = vpmaxsd_avx2(auVar32,auVar33);
                auVar33 = vpmaxsd_avx2(ZEXT1632(auVar26),auVar36);
                auVar36 = vpmaxsd_avx2(ZEXT1632(auVar27),auVar37);
                auVar36 = vpminsd_avx2(auVar33,auVar36);
                auVar33 = vpmaxsd_avx2(ZEXT1632(auVar28),auVar38);
                auVar36 = vpminsd_avx2(auVar36,auVar33);
                auVar51._4_4_ = uStack_585c;
                auVar51._0_4_ = local_5860;
                auVar51._8_4_ = uStack_5858;
                auVar51._12_4_ = uStack_5854;
                auVar51._16_4_ = uStack_5850;
                auVar51._20_4_ = uStack_584c;
                auVar51._24_4_ = uStack_5848;
                auVar51._28_4_ = uStack_5844;
                auVar33 = vpmaxsd_avx2(auVar32,auVar51);
                auVar36 = vpminsd_avx2(auVar36,local_5840);
                uVar13 = vpcmpd_avx512vl(auVar33,auVar36,2);
                uVar14 = uVar18;
                auVar52 = auVar34;
                if ((byte)uVar13 != 0) {
                  auVar33 = vblendmps_avx512vl(auVar35,auVar32);
                  bVar16 = (bool)((byte)uVar13 & 1);
                  auVar52._0_4_ = (uint)bVar16 * auVar33._0_4_ | (uint)!bVar16 * auVar32._0_4_;
                  bVar16 = (bool)((byte)(uVar13 >> 1) & 1);
                  auVar52._4_4_ = (uint)bVar16 * auVar33._4_4_ | (uint)!bVar16 * auVar32._4_4_;
                  bVar16 = (bool)((byte)(uVar13 >> 2) & 1);
                  auVar52._8_4_ = (uint)bVar16 * auVar33._8_4_ | (uint)!bVar16 * auVar32._8_4_;
                  bVar16 = (bool)((byte)(uVar13 >> 3) & 1);
                  auVar52._12_4_ = (uint)bVar16 * auVar33._12_4_ | (uint)!bVar16 * auVar32._12_4_;
                  bVar16 = (bool)((byte)(uVar13 >> 4) & 1);
                  auVar52._16_4_ = (uint)bVar16 * auVar33._16_4_ | (uint)!bVar16 * auVar32._16_4_;
                  bVar16 = (bool)((byte)(uVar13 >> 5) & 1);
                  auVar52._20_4_ = (uint)bVar16 * auVar33._20_4_ | (uint)!bVar16 * auVar32._20_4_;
                  bVar16 = (bool)((byte)(uVar13 >> 6) & 1);
                  auVar52._24_4_ = (uint)bVar16 * auVar33._24_4_ | (uint)!bVar16 * auVar32._24_4_;
                  bVar16 = SUB81(uVar13 >> 7,0);
                  auVar52._28_4_ = (uint)bVar16 * auVar33._28_4_ | (uint)!bVar16 * auVar32._28_4_;
                  uVar14 = uVar4;
                  if (uVar18 != 8) {
                    *puVar24 = uVar18;
                    puVar24 = puVar24 + 1;
                    *pauVar23 = auVar34;
                    pauVar23 = pauVar23 + 1;
                  }
                }
                auVar34 = auVar52;
                uVar18 = uVar14;
              }
              if (uVar18 == 8) goto LAB_01ddc30a;
              uVar11 = vcmpps_avx512vl(auVar34,local_5840,9);
              root.ptr = uVar18;
            } while ((byte)uVar25 < (byte)POPCOUNT((int)uVar11));
            *puVar24 = uVar18;
            puVar24 = puVar24 + 1;
            *pauVar23 = auVar34;
            pauVar23 = pauVar23 + 1;
LAB_01ddc30a:
            iVar53 = 4;
          }
          else {
            while (bVar15 = (byte)local_5adc, local_5a80 != 0) {
              k = 0;
              for (uVar18 = local_5a80; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000
                  ) {
                k = k + 1;
              }
              local_5aa0._0_8_ = k;
              local_5a80 = local_5a80 - 1 & local_5a80;
              bVar16 = occluded1(local_5ab0,local_5ab8,root,k,&local_5acd,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,local_5ac0);
              bVar19 = (byte)(1 << (local_5aa0._0_4_ & 0x1f));
              if (!bVar16) {
                bVar19 = 0;
              }
              local_5adc = (uint)(bVar15 | bVar19);
            }
            iVar53 = 3;
            auVar63 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar65 = ZEXT3264(local_5a60);
            if (bVar15 != 0xff) {
              auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5840._0_4_ =
                   (uint)(bVar15 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar15 & 1) * local_5840._0_4_
              ;
              bVar16 = (bool)((byte)(local_5adc >> 1) & 1);
              local_5840._4_4_ = (uint)bVar16 * auVar35._4_4_ | (uint)!bVar16 * local_5840._4_4_;
              bVar16 = (bool)((byte)(local_5adc >> 2) & 1);
              local_5840._8_4_ = (uint)bVar16 * auVar35._8_4_ | (uint)!bVar16 * local_5840._8_4_;
              bVar16 = (bool)((byte)(local_5adc >> 3) & 1);
              local_5840._12_4_ = (uint)bVar16 * auVar35._12_4_ | (uint)!bVar16 * local_5840._12_4_;
              bVar16 = (bool)((byte)(local_5adc >> 4) & 1);
              local_5840._16_4_ = (uint)bVar16 * auVar35._16_4_ | (uint)!bVar16 * local_5840._16_4_;
              bVar16 = (bool)((byte)(local_5adc >> 5) & 1);
              local_5840._20_4_ = (uint)bVar16 * auVar35._20_4_ | (uint)!bVar16 * local_5840._20_4_;
              bVar16 = (bool)((byte)(local_5adc >> 6) & 1);
              local_5840._24_4_ = (uint)bVar16 * auVar35._24_4_ | (uint)!bVar16 * local_5840._24_4_;
              local_5840._28_4_ =
                   (local_5adc >> 7) * auVar35._28_4_ |
                   (uint)!SUB41(local_5adc >> 7,0) * local_5840._28_4_;
              iVar53 = 2;
            }
            if ((uint)uVar25 < (uint)local_5ac8) goto LAB_01ddc1a6;
          }
        } while (iVar53 != 3);
LAB_01ddc8fc:
        local_5adc._0_1_ = (byte)local_5adc & (byte)local_5acc;
        bVar16 = (bool)((byte)local_5adc >> 1 & 1);
        bVar5 = (bool)((byte)local_5adc >> 2 & 1);
        bVar6 = (bool)((byte)local_5adc >> 3 & 1);
        bVar7 = (bool)((byte)local_5adc >> 4 & 1);
        bVar8 = (bool)((byte)local_5adc >> 5 & 1);
        bVar9 = (bool)((byte)local_5adc >> 6 & 1);
        *(uint *)local_5aa8 =
             (uint)((byte)local_5adc & 1) * -0x800000 |
             (uint)!(bool)((byte)local_5adc & 1) * *(int *)local_5aa8;
        *(uint *)(local_5aa8 + 4) =
             (uint)bVar16 * -0x800000 | (uint)!bVar16 * *(int *)(local_5aa8 + 4);
        *(uint *)(local_5aa8 + 8) =
             (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_5aa8 + 8);
        *(uint *)(local_5aa8 + 0xc) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5aa8 + 0xc);
        *(uint *)(local_5aa8 + 0x10) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5aa8 + 0x10);
        *(uint *)(local_5aa8 + 0x14) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5aa8 + 0x14);
        *(uint *)(local_5aa8 + 0x18) =
             (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_5aa8 + 0x18);
        *(uint *)(local_5aa8 + 0x1c) =
             (uint)((byte)local_5adc >> 7) * -0x800000 |
             (uint)!(bool)((byte)local_5adc >> 7) * *(int *)(local_5aa8 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01ddc3b1:
  do {
    if (lVar17 == (ulong)((uint)root.ptr & 0xf) - 8) goto LAB_01ddc7e6;
    lVar20 = -0x10;
    bVar19 = bVar15;
    do {
      if ((lVar20 == 0) || (uVar18 = (ulong)*(uint *)(lVar22 + 0x10 + lVar20), uVar18 == 0xffffffff)
         ) goto LAB_01ddc7d1;
      auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0xb0 + lVar20)));
      auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0xa0 + lVar20)));
      auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0x90 + lVar20)));
      uVar1 = *(undefined4 *)(lVar22 + -0x80 + lVar20);
      auVar26._4_4_ = uVar1;
      auVar26._0_4_ = uVar1;
      auVar26._8_4_ = uVar1;
      auVar26._12_4_ = uVar1;
      auVar64._16_4_ = uVar1;
      auVar64._0_16_ = auVar26;
      auVar64._20_4_ = uVar1;
      auVar64._24_4_ = uVar1;
      auVar64._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar22 + -0x70 + lVar20);
      auVar27._4_4_ = uVar1;
      auVar27._0_4_ = uVar1;
      auVar27._8_4_ = uVar1;
      auVar27._12_4_ = uVar1;
      auVar66._16_4_ = uVar1;
      auVar66._0_16_ = auVar27;
      auVar66._20_4_ = uVar1;
      auVar66._24_4_ = uVar1;
      auVar66._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar22 + -0x60 + lVar20);
      auVar28._4_4_ = uVar1;
      auVar28._0_4_ = uVar1;
      auVar28._8_4_ = uVar1;
      auVar28._12_4_ = uVar1;
      auVar67._16_4_ = uVar1;
      auVar67._0_16_ = auVar28;
      auVar67._20_4_ = uVar1;
      auVar67._24_4_ = uVar1;
      auVar67._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar22 + -0x20 + lVar20);
      auVar29._4_4_ = uVar1;
      auVar29._0_4_ = uVar1;
      auVar29._8_4_ = uVar1;
      auVar29._12_4_ = uVar1;
      auVar68._16_4_ = uVar1;
      auVar68._0_16_ = auVar29;
      auVar68._20_4_ = uVar1;
      auVar68._24_4_ = uVar1;
      auVar68._28_4_ = uVar1;
      uVar2 = *(undefined4 *)(lVar22 + -0x10 + lVar20);
      auVar30._4_4_ = uVar2;
      auVar30._0_4_ = uVar2;
      auVar30._8_4_ = uVar2;
      auVar30._12_4_ = uVar2;
      auVar69._16_4_ = uVar2;
      auVar69._0_16_ = auVar30;
      auVar69._20_4_ = uVar2;
      auVar69._24_4_ = uVar2;
      auVar69._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar22 + lVar20);
      auVar31._4_4_ = uVar2;
      auVar31._0_4_ = uVar2;
      auVar31._8_4_ = uVar2;
      auVar31._12_4_ = uVar2;
      auVar70._16_4_ = uVar2;
      auVar70._0_16_ = auVar31;
      auVar70._20_4_ = uVar2;
      auVar70._24_4_ = uVar2;
      auVar70._28_4_ = uVar2;
      auVar26 = vsubss_avx512f(auVar36._0_16_,auVar26);
      auVar39 = vbroadcastss_avx512vl(auVar26);
      auVar27 = vsubss_avx512f(auVar37._0_16_,auVar27);
      auVar40 = vbroadcastss_avx512vl(auVar27);
      auVar28 = vsubss_avx512f(auVar38._0_16_,auVar28);
      auVar41 = vbroadcastss_avx512vl(auVar28);
      auVar29 = vsubss_avx512f(auVar29,auVar36._0_16_);
      auVar42 = vbroadcastss_avx512vl(auVar29);
      auVar30 = vsubss_avx512f(auVar30,auVar37._0_16_);
      auVar43 = vbroadcastss_avx512vl(auVar30);
      auVar31 = vsubss_avx512f(auVar31,auVar38._0_16_);
      auVar44 = vbroadcastss_avx512vl(auVar31);
      auVar27 = vmulss_avx512f(auVar27,auVar31);
      auVar45 = vbroadcastss_avx512vl(auVar27);
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar43,auVar41);
      auVar27 = vmulss_avx512f(auVar28,auVar29);
      auVar46 = vbroadcastss_avx512vl(auVar27);
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar44,auVar39);
      auVar26 = vmulss_avx512f(auVar26,auVar30);
      auVar47 = vbroadcastss_avx512vl(auVar26);
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar42,auVar40);
      auVar36 = vsubps_avx512vl(auVar36,*(undefined1 (*) [32])ray);
      auVar37 = vsubps_avx512vl(auVar37,*(undefined1 (*) [32])(ray + 0x20));
      auVar48 = vsubps_avx512vl(auVar38,*(undefined1 (*) [32])(ray + 0x40));
      auVar38 = vmulps_avx512vl(auVar34,auVar48);
      auVar49 = vfmsub231ps_avx512vl(auVar38,auVar37,auVar32);
      auVar38 = vmulps_avx512vl(auVar32,auVar36);
      auVar50 = vfmsub231ps_avx512vl(auVar38,auVar48,auVar33);
      auVar38 = vmulps_avx512vl(auVar33,auVar37);
      auVar51 = vfmsub231ps_avx512vl(auVar38,auVar36,auVar34);
      auVar38 = vmulps_avx512vl(auVar47,auVar32);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar46,auVar34);
      auVar52 = vfmadd231ps_avx512vl(auVar38,auVar45,auVar33);
      auVar38._8_4_ = 0x80000000;
      auVar38._0_8_ = 0x8000000080000000;
      auVar38._12_4_ = 0x80000000;
      auVar38._16_4_ = 0x80000000;
      auVar38._20_4_ = 0x80000000;
      auVar38._24_4_ = 0x80000000;
      auVar38._28_4_ = 0x80000000;
      vandps_avx512vl(auVar52,auVar38);
      auVar38 = vmulps_avx512vl(auVar44,auVar51);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar50,auVar43);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar49,auVar42);
      auVar38 = vxorps_avx512vl(auVar52,auVar38);
      uVar11 = vcmpps_avx512vl(auVar38,_DAT_01f7b000,5);
      bVar21 = (byte)uVar11 & bVar19;
      if (bVar21 != 0) {
        auVar41 = vmulps_avx512vl(auVar41,auVar51);
        auVar40 = vfmadd213ps_avx512vl(auVar40,auVar50,auVar41);
        auVar39 = vfmadd213ps_avx512vl(auVar39,auVar49,auVar40);
        auVar39 = vxorps_avx512vl(auVar52,auVar39);
        uVar11 = vcmpps_avx512vl(auVar39,_DAT_01f7b000,5);
        bVar21 = bVar21 & (byte)uVar11;
        if (bVar21 != 0) {
          auVar40._8_4_ = 0x7fffffff;
          auVar40._0_8_ = 0x7fffffff7fffffff;
          auVar40._12_4_ = 0x7fffffff;
          auVar40._16_4_ = 0x7fffffff;
          auVar40._20_4_ = 0x7fffffff;
          auVar40._24_4_ = 0x7fffffff;
          auVar40._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar52,auVar40);
          auVar38 = vsubps_avx512vl(auVar39,auVar38);
          uVar11 = vcmpps_avx512vl(auVar38,auVar39,5);
          bVar21 = bVar21 & (byte)uVar11;
          if (bVar21 != 0) {
            auVar38 = vmulps_avx512vl(auVar47,auVar48);
            auVar37 = vfmadd213ps_avx512vl(auVar37,auVar46,auVar38);
            auVar36 = vfmadd213ps_avx512vl(auVar36,auVar45,auVar37);
            auVar36 = vxorps_avx512vl(auVar52,auVar36);
            auVar37 = vmulps_avx512vl(auVar39,*(undefined1 (*) [32])(ray + 0x60));
            auVar38 = vmulps_avx512vl(auVar39,local_5aa0);
            uVar11 = vcmpps_avx512vl(auVar36,auVar38,2);
            uVar12 = vcmpps_avx512vl(auVar37,auVar36,1);
            bVar21 = bVar21 & (byte)uVar11 & (byte)uVar12;
            if (bVar21 != 0) {
              uVar11 = vcmpps_avx512vl(auVar52,_DAT_01f7b000,4);
              bVar21 = bVar21 & (byte)uVar11;
              if (bVar21 != 0) {
                uVar3 = ((local_5ac0->scene->geometries).items[uVar18].ptr)->mask;
                auVar39._4_4_ = uVar3;
                auVar39._0_4_ = uVar3;
                auVar39._8_4_ = uVar3;
                auVar39._12_4_ = uVar3;
                auVar39._16_4_ = uVar3;
                auVar39._20_4_ = uVar3;
                auVar39._24_4_ = uVar3;
                auVar39._28_4_ = uVar3;
                uVar11 = vptestmd_avx512vl(*(undefined1 (*) [32])(ray + 0x120),auVar39);
                bVar21 = bVar21 & (byte)uVar11;
                if (bVar21 != 0) {
                  bVar19 = bVar19 & ~bVar21;
                }
              }
            }
          }
        }
      }
      if (bVar19 == 0) break;
      uVar2 = *(undefined4 *)(lVar22 + -0x50 + lVar20);
      auVar50._4_4_ = uVar2;
      auVar50._0_4_ = uVar2;
      auVar50._8_4_ = uVar2;
      auVar50._12_4_ = uVar2;
      auVar50._16_4_ = uVar2;
      auVar50._20_4_ = uVar2;
      auVar50._24_4_ = uVar2;
      auVar50._28_4_ = uVar2;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0x40 + lVar20)));
      auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar22 + -0x30 + lVar20)));
      auVar39 = vsubps_avx512vl(auVar50,auVar68);
      auVar40 = vsubps_avx512vl(auVar37,auVar69);
      auVar43 = vsubps_avx512vl(auVar38,auVar70);
      auVar44 = vsubps_avx512vl(auVar64,auVar50);
      auVar45 = vsubps_avx512vl(auVar66,auVar37);
      auVar46 = vsubps_avx512vl(auVar67,auVar38);
      auVar36 = vmulps_avx512vl(auVar40,auVar46);
      auVar47 = vfmsub231ps_avx512vl(auVar36,auVar45,auVar43);
      auVar36 = vmulps_avx512vl(auVar43,auVar44);
      auVar48 = vfmsub231ps_avx512vl(auVar36,auVar46,auVar39);
      auVar36 = vmulps_avx512vl(auVar39,auVar45);
      auVar49 = vfmsub231ps_avx512vl(auVar36,auVar44,auVar40);
      auVar36 = vsubps_avx(auVar50,*(undefined1 (*) [32])ray);
      auVar37 = vsubps_avx512vl(auVar37,*(undefined1 (*) [32])(ray + 0x20));
      auVar38 = vsubps_avx512vl(auVar38,*(undefined1 (*) [32])(ray + 0x40));
      auVar41 = vmulps_avx512vl(auVar34,auVar38);
      auVar50 = vfmsub231ps_avx512vl(auVar41,auVar37,auVar32);
      auVar41 = vmulps_avx512vl(auVar32,auVar36);
      auVar51 = vfmsub231ps_avx512vl(auVar41,auVar38,auVar33);
      auVar41 = vmulps_avx512vl(auVar33,auVar37);
      auVar52 = vfmsub231ps_avx512vl(auVar41,auVar36,auVar34);
      auVar42._4_4_ = auVar49._4_4_ * auVar32._4_4_;
      auVar42._0_4_ = auVar49._0_4_ * auVar32._0_4_;
      auVar42._8_4_ = auVar49._8_4_ * auVar32._8_4_;
      auVar42._12_4_ = auVar49._12_4_ * auVar32._12_4_;
      auVar42._16_4_ = auVar49._16_4_ * auVar32._16_4_;
      auVar42._20_4_ = auVar49._20_4_ * auVar32._20_4_;
      auVar42._24_4_ = auVar49._24_4_ * auVar32._24_4_;
      auVar42._28_4_ = uVar1;
      auVar26 = vfmadd231ps_fma(auVar42,auVar48,auVar34);
      auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar47,auVar33);
      auVar41._8_4_ = 0x80000000;
      auVar41._0_8_ = 0x8000000080000000;
      auVar41._12_4_ = 0x80000000;
      auVar41._16_4_ = 0x80000000;
      auVar41._20_4_ = 0x80000000;
      auVar41._24_4_ = 0x80000000;
      auVar41._28_4_ = 0x80000000;
      vandps_avx512vl(ZEXT1632(auVar26),auVar41);
      auVar41 = vmulps_avx512vl(auVar46,auVar52);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar51,auVar45);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar50,auVar44);
      auVar41 = vxorps_avx512vl(auVar52,auVar41);
      uVar11 = vcmpps_avx512vl(auVar41,_DAT_01f7b000,5);
      bVar21 = (byte)uVar11 & bVar19;
      if (bVar21 != 0) {
        auVar42 = vmulps_avx512vl(auVar43,auVar52);
        auVar40 = vfmadd213ps_avx512vl(auVar40,auVar51,auVar42);
        auVar39 = vfmadd213ps_avx512vl(auVar39,auVar50,auVar40);
        auVar39 = vxorps_avx512vl(auVar52,auVar39);
        uVar11 = vcmpps_avx512vl(auVar39,_DAT_01f7b000,5);
        bVar21 = bVar21 & (byte)uVar11;
        if (bVar21 != 0) {
          auVar43._8_4_ = 0x7fffffff;
          auVar43._0_8_ = 0x7fffffff7fffffff;
          auVar43._12_4_ = 0x7fffffff;
          auVar43._16_4_ = 0x7fffffff;
          auVar43._20_4_ = 0x7fffffff;
          auVar43._24_4_ = 0x7fffffff;
          auVar43._28_4_ = 0x7fffffff;
          vandps_avx512vl(ZEXT1632(auVar26),auVar43);
          auVar40 = vsubps_avx512vl(auVar39,auVar41);
          uVar11 = vcmpps_avx512vl(auVar40,auVar39,5);
          bVar21 = bVar21 & (byte)uVar11;
          if (bVar21 != 0) {
            auVar38 = vmulps_avx512vl(auVar49,auVar38);
            auVar27 = vfmadd213ps_fma(auVar37,auVar48,auVar38);
            auVar27 = vfmadd213ps_fma(auVar36,auVar47,ZEXT1632(auVar27));
            auVar36 = vxorps_avx512vl(auVar52,ZEXT1632(auVar27));
            auVar37 = vmulps_avx512vl(auVar39,*(undefined1 (*) [32])(ray + 0x60));
            auVar38 = vmulps_avx512vl(auVar39,local_5aa0);
            uVar11 = vcmpps_avx512vl(auVar36,auVar38,2);
            uVar12 = vcmpps_avx512vl(auVar37,auVar36,1);
            bVar21 = bVar21 & (byte)uVar11 & (byte)uVar12;
            if (bVar21 != 0) {
              uVar11 = vcmpps_avx512vl(ZEXT1632(auVar26),_DAT_01f7b000,4);
              bVar21 = bVar21 & (byte)uVar11;
              if (bVar21 != 0) {
                uVar3 = ((local_5ac0->scene->geometries).items[uVar18].ptr)->mask;
                auVar44._4_4_ = uVar3;
                auVar44._0_4_ = uVar3;
                auVar44._8_4_ = uVar3;
                auVar44._12_4_ = uVar3;
                auVar44._16_4_ = uVar3;
                auVar44._20_4_ = uVar3;
                auVar44._24_4_ = uVar3;
                auVar44._28_4_ = uVar3;
                uVar11 = vptestmd_avx512vl(*(undefined1 (*) [32])(ray + 0x120),auVar44);
                bVar21 = bVar21 & (byte)uVar11;
                if (bVar21 != 0) {
                  bVar19 = bVar19 & ~bVar21;
                }
              }
            }
          }
        }
      }
      lVar20 = lVar20 + 4;
    } while (bVar19 != 0);
    bVar19 = 0;
LAB_01ddc7d1:
    lVar17 = lVar17 + 1;
    lVar22 = lVar22 + 0xe0;
    bVar15 = bVar15 & bVar19;
  } while (bVar15 != 0);
  bVar15 = 0;
LAB_01ddc7e6:
  bVar15 = (byte)local_5adc | ~bVar15;
  local_5adc = (uint)bVar15;
  if (bVar15 == 0xff) {
    local_5adc._0_1_ = 0xff;
    goto LAB_01ddc8fc;
  }
  auVar63 = ZEXT3264(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  iVar53 = local_5840._0_4_;
  bVar16 = (bool)(bVar15 >> 1 & 1);
  bVar5 = (bool)(bVar15 >> 2 & 1);
  iVar54 = local_5840._8_4_;
  bVar6 = (bool)(bVar15 >> 3 & 1);
  iVar55 = local_5840._12_4_;
  bVar7 = (bool)(bVar15 >> 4 & 1);
  iVar56 = local_5840._16_4_;
  bVar8 = (bool)(bVar15 >> 5 & 1);
  iVar57 = local_5840._20_4_;
  bVar9 = (bool)(bVar15 >> 6 & 1);
  iVar58 = local_5840._24_4_;
  iVar59 = local_5840._28_4_;
  local_5840._4_4_ = (uint)bVar16 * auVar35._4_4_ | (uint)!bVar16 * local_5840._4_4_;
  local_5840._0_4_ = (uint)(bVar15 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar15 & 1) * iVar53;
  local_5840._8_4_ = (uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * iVar54;
  local_5840._12_4_ = (uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * iVar55;
  local_5840._16_4_ = (uint)bVar7 * auVar35._16_4_ | (uint)!bVar7 * iVar56;
  local_5840._20_4_ = (uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * iVar57;
  local_5840._24_4_ = (uint)bVar9 * auVar35._24_4_ | (uint)!bVar9 * iVar58;
  local_5840._28_4_ = (uint)(bVar15 >> 7) * auVar35._28_4_ | (uint)!(bool)(bVar15 >> 7) * iVar59;
  goto LAB_01ddc160;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }